

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void do_cmd_aim_wand(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_18;
  object *obj;
  command *cmd_local;
  
  obj = (object *)cmd;
  _Var1 = player_get_resume_normal_shape(player,(command_conflict *)cmd);
  if (_Var1) {
    wVar2 = cmd_get_item((command *)obj,"item",&local_18,"Aim which wand? ",
                         "You have no wands to aim.",tval_is_wand,L'F');
    if (wVar2 == L'\0') {
      _Var1 = obj_has_charges(local_18);
      if (_Var1) {
        _Var1 = use_aux((command *)obj,local_18,USE_CHARGE,L'\r');
        if (!_Var1) {
          cmd_set_repeat(L'\0');
        }
      }
      else {
        msg("That wand has no charges.");
        cmd_set_repeat(L'\0');
      }
    }
    else {
      cmd_set_repeat(L'\0');
    }
  }
  else {
    cmd_set_repeat(L'\0');
  }
  return;
}

Assistant:

void do_cmd_aim_wand(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		cmd_set_repeat(0);
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Aim which wand? ",
			"You have no wands to aim.",
			tval_is_wand,
			USE_INVEN | USE_FLOOR | SHOW_FAIL) != CMD_OK) {
		cmd_set_repeat(0);
		return;
	}

	if (!obj_has_charges(obj)) {
		msg("That wand has no charges.");
		cmd_set_repeat(0);
		return;
	}

	/* Disable autorepetition when successful. */
	if (!use_aux(cmd, obj, USE_CHARGE, MSG_ZAP_ROD)) {
		cmd_set_repeat(0);
	}
}